

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O1

void __thiscall amrex::BndryData::setValue(BndryData *this,Orientation face,int n,Real val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar9 = FabArrayBase::localindex((FabArrayBase *)((this->super_BndryRegister).bndry + face.val),n)
  ;
  auVar8 = _DAT_0077bb40;
  auVar7 = _DAT_0077bb30;
  iVar1 = this->m_ncomp;
  if (0 < (long)iVar1) {
    lVar12 = *(long *)((long)(this->super_BndryRegister).bndry[face.val].m_mf.
                             super_FabArray<amrex::FArrayBox>.m_fabs_v.
                             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)iVar9 * 8);
    iVar9 = *(int *)(lVar12 + 0x18);
    iVar2 = *(int *)(lVar12 + 0x1c);
    iVar3 = *(int *)(lVar12 + 0x20);
    iVar4 = *(int *)(lVar12 + 0x24);
    iVar5 = *(int *)(lVar12 + 0x28);
    iVar6 = *(int *)(lVar12 + 0x2c);
    uVar10 = iVar4 - iVar9;
    auVar19._4_4_ = 0;
    auVar19._0_4_ = uVar10;
    auVar19._8_4_ = uVar10;
    auVar19._12_4_ = 0;
    lVar16 = *(long *)(lVar12 + 0x10) + 8;
    lVar14 = (long)((iVar5 - iVar2) + 1) * (long)(int)(uVar10 + 1);
    lVar12 = 0;
    auVar19 = auVar19 ^ _DAT_0077bb40;
    do {
      lVar13 = lVar16;
      iVar17 = iVar3;
      if (iVar3 <= iVar6) {
        do {
          lVar11 = lVar13;
          iVar15 = iVar2;
          if (iVar2 <= iVar5) {
            do {
              if (iVar9 <= iVar4) {
                uVar18 = 0;
                do {
                  auVar20._8_4_ = (int)uVar18;
                  auVar20._0_8_ = uVar18;
                  auVar20._12_4_ = (int)(uVar18 >> 0x20);
                  auVar20 = (auVar20 | auVar7) ^ auVar8;
                  if ((bool)(~(auVar19._4_4_ < auVar20._4_4_ ||
                              auVar19._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar19._4_4_) & 1))
                  {
                    *(Real *)(lVar11 + -8 + uVar18 * 8) = val;
                  }
                  if (auVar20._12_4_ <= auVar19._12_4_ &&
                      (auVar20._8_4_ <= auVar19._8_4_ || auVar20._12_4_ != auVar19._12_4_)) {
                    *(Real *)(lVar11 + uVar18 * 8) = val;
                  }
                  uVar18 = uVar18 + 2;
                } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar18);
              }
              iVar15 = iVar15 + 1;
              lVar11 = lVar11 + (long)(int)(uVar10 + 1) * 8;
            } while (iVar5 + 1 != iVar15);
          }
          iVar17 = iVar17 + 1;
          lVar13 = lVar13 + lVar14 * 8;
        } while (iVar6 + 1 != iVar17);
      }
      lVar12 = lVar12 + 1;
      lVar16 = lVar16 + ((iVar6 - iVar3) + 1) * lVar14 * 8;
    } while (lVar12 != iVar1);
  }
  return;
}

Assistant:

void
BndryData::setValue (Orientation face, int n, Real val) noexcept
{
    auto& fab = bndry[face][n];
    auto arr = fab.array();
    const Box& bx = fab.box();
    const int ncomp = m_ncomp;
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, m,
    {
        arr(i,j,k,m) = val;
    });
}